

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O2

int secp256k1_eckey_pubkey_tweak_mul(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  secp256k1_scalar local_b8;
  secp256k1_gej pt;
  
  iVar1 = secp256k1_scalar_is_zero(tweak);
  if (iVar1 == 0) {
    local_b8.d[2] = 0;
    local_b8.d[3] = 0;
    local_b8.d[0] = 0;
    local_b8.d[1] = 0;
    pt.infinity = key->infinity;
    pt.x.n[0] = (key->x).n[0];
    pt.x.n[1] = (key->x).n[1];
    pt.x.n[2] = (key->x).n[2];
    pt.x.n[3] = (key->x).n[3];
    pt.x.n[4] = (key->x).n[4];
    pt.y.n[0] = (key->y).n[0];
    pt.y.n[1] = (key->y).n[1];
    pt.y.n[2] = (key->y).n[2];
    pt.y.n[3] = (key->y).n[3];
    pt.y.n[4] = (key->y).n[4];
    pt.z.n[0] = 1;
    pt.z.n[1] = 0;
    pt.z.n[2] = 0;
    pt.z.n[3] = 0;
    pt.z.n[4] = 0;
    secp256k1_ecmult(&pt,&pt,tweak,&local_b8);
    secp256k1_ge_set_gej(key,&pt);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_mul(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_scalar zero;
    secp256k1_gej pt;
    if (secp256k1_scalar_is_zero(tweak)) {
        return 0;
    }

    secp256k1_scalar_set_int(&zero, 0);
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(&pt, &pt, tweak, &zero);
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}